

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIStaticText.cpp
# Opt level: O2

void __thiscall irr::gui::CGUIStaticText::~CGUIStaticText(CGUIStaticText *this,void **vtt)

{
  void *pvVar1;
  IGUIFont *pIVar2;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[5];
  pIVar2 = this->OverrideFont;
  if (pIVar2 != (IGUIFont *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&pIVar2->_vptr_IGUIFont + (long)pIVar2->_vptr_IGUIFont[-3]));
  }
  std::vector<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>::~vector
            (&(this->BrokenText).m_data);
  IGUIElement::~IGUIElement((IGUIElement *)this,vtt + 2);
  return;
}

Assistant:

CGUIStaticText::~CGUIStaticText()
{
	if (OverrideFont)
		OverrideFont->drop();
}